

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int ParseLocalArrayChunk(void *chunk,ACSLocalArrays *arrays,int offset)

{
  ushort uVar1;
  uint uVar2;
  ACSLocalArrayInfo *pAVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  uVar1 = *(ushort *)((long)chunk + 4);
  iVar6 = uVar1 + 1;
  if (-1 < (int)(uVar1 - 2)) {
    iVar6 = uVar1 - 2;
  }
  uVar5 = iVar6 >> 2;
  arrays->Count = uVar5;
  if (5 < uVar1) {
    pAVar3 = (ACSLocalArrayInfo *)operator_new__((ulong)uVar5 << 3);
    arrays->Info = pAVar3;
    uVar4 = 0;
    do {
      uVar2 = *(uint *)((long)chunk + uVar4 * 4 + 10);
      pAVar3[uVar4].Size = uVar2;
      pAVar3[uVar4].Offset = offset;
      offset = offset + uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar5 + (uVar5 == 0) != uVar4);
  }
  return offset;
}

Assistant:

static int ParseLocalArrayChunk(void *chunk, ACSLocalArrays *arrays, int offset)
{
	unsigned count = (LittleShort(static_cast<unsigned short>(((unsigned *)chunk)[1]) - 2)) / 4;
	int *sizes = (int *)((BYTE *)chunk + 10);
	arrays->Count = count;
	if (count > 0)
	{
		ACSLocalArrayInfo *info = new ACSLocalArrayInfo[count];
		arrays->Info = info;
		for (unsigned i = 0; i < count; ++i)
		{
			info[i].Size = LittleLong(sizes[i]);
			info[i].Offset = offset;
			offset += info[i].Size;
		}
	}
	// Return the new local variable size, with space for the arrays
	return offset;
}